

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ValueArray<std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
* __thiscall
testing::
Values<std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>>
          (ValueArray<std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
           *__return_storage_ptr__,testing *this,tuple<unsigned_int,_unsigned_int,_const_char_*> *v,
          tuple<unsigned_int,_unsigned_int,_const_char_*> *v_1,
          tuple<unsigned_int,_unsigned_int,_const_char_*> *v_2,
          tuple<unsigned_int,_unsigned_int,_const_char_*> *v_3,
          tuple<unsigned_int,_unsigned_int,_const_char_*> *v_4,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_5,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_6,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_7,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_8,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_9,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_10,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_11,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_12,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_13,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_14,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_15,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_16,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_17,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_18,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_19,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_20,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_21,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_22,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_23,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_24,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_25,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_26,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_27,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_28,
          tuple<unsigned_int,_unsigned_int,_const_char_*> v_29)

{
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  _Head_base<2UL,_const_char_*,_false> local_110;
  undefined8 local_108;
  _Head_base<2UL,_const_char_*,_false> local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  _Head_base<2UL,_const_char_*,_false> local_70;
  undefined8 local_68;
  _Head_base<2UL,_const_char_*,_false> local_60;
  undefined8 local_58;
  _Head_base<2UL,_const_char_*,_false> local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = *(undefined8 *)this;
  local_38 = *(undefined8 *)(this + 8);
  local_50._M_head_impl =
       (v->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
       super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  local_48 = *(undefined8 *)
              &(v->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Head_base<1UL,_unsigned_int,_false>;
  local_100._M_head_impl =
       (v_1->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
       super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  local_f8 = *(undefined8 *)
              &(v_1->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Head_base<1UL,_unsigned_int,_false>;
  local_60._M_head_impl =
       (v_2->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
       super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  local_58 = *(undefined8 *)
              &(v_2->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Head_base<1UL,_unsigned_int,_false>;
  local_70._M_head_impl =
       (v_3->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
       super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  local_68 = *(undefined8 *)
              &(v_3->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Head_base<1UL,_unsigned_int,_false>;
  local_110._M_head_impl =
       (v_4->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
       super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  local_108 = *(undefined8 *)
               &(v_4->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>).
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                super__Head_base<1UL,_unsigned_int,_false>;
  local_120 = *(undefined8 *)
               v_5.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_118 = *(undefined8 *)
               ((long)v_5.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_130 = *(undefined8 *)
               v_5.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_128 = *(undefined8 *)
               (v_5.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_140 = *(undefined8 *)
               v_6.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_138 = *(undefined8 *)
               ((long)v_6.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_150 = *(undefined8 *)
               v_6.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_148 = *(undefined8 *)
               (v_6.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_160 = *(undefined8 *)
               v_7.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_158 = *(undefined8 *)
               ((long)v_7.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_170 = *(undefined8 *)
               v_7.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_168 = *(undefined8 *)
               (v_7.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_180 = *(undefined8 *)
               v_8.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_178 = *(undefined8 *)
               ((long)v_8.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_190 = *(undefined8 *)
               v_8.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_188 = *(undefined8 *)
               (v_8.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_1a0 = *(undefined8 *)
               v_9.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_198 = *(undefined8 *)
               ((long)v_9.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_1b0 = *(undefined8 *)
               v_9.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_1a8 = *(undefined8 *)
               (v_9.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_1c0 = *(undefined8 *)
               v_10.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_1b8 = *(undefined8 *)
               ((long)v_10.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_1d0 = *(undefined8 *)
               v_10.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_1c8 = *(undefined8 *)
               (v_10.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_1e0 = *(undefined8 *)
               v_11.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_1d8 = *(undefined8 *)
               ((long)v_11.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_1f0 = *(undefined8 *)
               v_11.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_1e8 = *(undefined8 *)
               (v_11.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_200 = *(undefined8 *)
               v_12.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
               super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
               _M_head_impl;
  local_1f8 = *(undefined8 *)
               ((long)v_12.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                      super__Tuple_impl<2UL,_const_char_*>.
                      super__Head_base<2UL,_const_char_*,_false>._M_head_impl + 8);
  local_210 = *(undefined8 *)
               v_12.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_208 = *(undefined8 *)
               (v_12.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_80 = *(undefined8 *)
              v_13.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
              super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
              _M_head_impl;
  local_78 = *(undefined8 *)
              ((long)v_13.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
                     ._M_head_impl + 8);
  local_90 = *(undefined8 *)
              v_13.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_88 = *(undefined8 *)
              (v_13.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_a0 = *(undefined8 *)
              v_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
              super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
              _M_head_impl;
  local_98 = *(undefined8 *)
              ((long)v_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
                     ._M_head_impl + 8);
  local_b0 = *(undefined8 *)
              v_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_a8 = *(undefined8 *)
              (v_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_c0 = *(undefined8 *)
              v_15.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
              super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
              _M_head_impl;
  local_b8 = *(undefined8 *)
              ((long)v_15.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
                     ._M_head_impl + 8);
  local_d0 = *(undefined8 *)
              v_15.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_c8 = *(undefined8 *)
              (v_15.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  local_e0 = *(undefined8 *)
              v_16.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
              super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
              _M_head_impl;
  local_d8 = *(undefined8 *)
              ((long)v_16.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<1UL,_unsigned_int,_const_char_*>.
                     super__Tuple_impl<2UL,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
                     ._M_head_impl + 8);
  local_f0 = *(undefined8 *)
              v_16.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
              super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_;
  local_e8 = *(undefined8 *)
              (v_16.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_const_char_*>.
               super__Tuple_impl<1UL,_unsigned_int,_const_char_*>._8_8_ + 8);
  internal::
  FlatTupleBase<testing::internal::FlatTuple<std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul>>
  ::
  FlatTupleBase<std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>>
            ((FlatTupleBase<testing::internal::FlatTuple<std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul>>
              *)__return_storage_ptr__,&local_40,&local_50,&local_100,&local_60,&local_70,&local_110
             ,&local_120,&local_130,&local_140,&local_150,&local_160,&local_170,&local_180,
             &local_190,&local_1a0,&local_1b0,&local_1c0,&local_1d0,&local_1e0,&local_1f0,&local_200
             ,&local_210,&local_80,&local_90,&local_a0,&local_b0,&local_c0,&local_d0,&local_e0,
             &local_f0);
  return __return_storage_ptr__;
}

Assistant:

internal::ValueArray<T...> Values(T... v) {
  return internal::ValueArray<T...>(std::move(v)...);
}